

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void leveldb::anon_unknown_1::PosixEnv::BackgroundThreadEntryPoint(PosixEnv *env)

{
  _func_void_void_ptr *p_Var1;
  void *pvVar2;
  _Map_pointer ppBVar3;
  _Elt_pointer pBVar4;
  
  do {
    std::mutex::lock(&(env->background_work_mutex_).mu_);
    while (pBVar4 = (env->background_work_queue_).c.
                    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (env->background_work_queue_).c.
          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur == pBVar4) {
      port::CondVar::Wait(&env->background_work_cv_);
    }
    p_Var1 = pBVar4->function;
    pvVar2 = pBVar4->arg;
    if (pBVar4 == (env->background_work_queue_).c.
                  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete((env->background_work_queue_).c.
                      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first);
      ppBVar3 = (env->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      (env->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = ppBVar3 + 1;
      pBVar4 = ppBVar3[1];
      (env->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pBVar4;
      (env->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = pBVar4 + 0x20;
    }
    else {
      pBVar4 = pBVar4 + 1;
    }
    (env->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur = pBVar4;
    pthread_mutex_unlock((pthread_mutex_t *)&env->background_work_mutex_);
    (*p_Var1)(pvVar2);
  } while( true );
}

Assistant:

static void BackgroundThreadEntryPoint(PosixEnv* env) {
    env->BackgroundThreadMain();
  }